

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseReference(xmlParserCtxtPtr ctxt)

{
  charactersSAXFunc p_Var1;
  void *pvVar2;
  _xmlNode *p_Var3;
  int iVar4;
  xmlChar *pxVar5;
  xmlEntityPtr ent_00;
  xmlNodePtr pxVar6;
  int len_1;
  xmlNodePtr last;
  _xmlNode *p_Stack_60;
  int len;
  xmlNodePtr cur;
  xmlNodePtr copy;
  xmlChar local_48 [4];
  int value;
  xmlChar out [16];
  int local_2c;
  int i;
  xmlChar *val;
  xmlChar *name;
  xmlEntityPtr ent;
  xmlParserCtxtPtr ctxt_local;
  
  if (*ctxt->input->cur == '&') {
    if (ctxt->input->cur[1] == '#') {
      iVar4 = xmlParseCharRef(ctxt);
      if (iVar4 != 0) {
        if (iVar4 < 0x80) {
          local_48[0] = (xmlChar)iVar4;
          local_2c = 1;
        }
        else {
          local_2c = xmlCopyCharMultiByte(local_48,iVar4);
        }
        local_48[local_2c] = '\0';
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
            (ctxt->sax->characters != (charactersSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
          (*ctxt->sax->characters)(ctxt->userData,local_48,local_2c);
        }
      }
    }
    else {
      pxVar5 = xmlParseEntityRefInternal(ctxt);
      if (pxVar5 != (xmlChar *)0x0) {
        ent_00 = xmlLookupGeneralEntity(ctxt,pxVar5,0);
        if (ent_00 == (xmlEntityPtr)0x0) {
          if ((((ctxt->replaceEntities == 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
              (ctxt->disableSAX == 0)) && (ctxt->sax->reference != (referenceSAXFunc)0x0)) {
            (*ctxt->sax->reference)(ctxt->userData,pxVar5);
          }
        }
        else if (ctxt->wellFormed != 0) {
          if ((ent_00->name == (xmlChar *)0x0) || (ent_00->etype == XML_INTERNAL_PREDEFINED_ENTITY))
          {
            pxVar5 = ent_00->content;
            if ((pxVar5 != (xmlChar *)0x0) &&
               (((ctxt->sax != (_xmlSAXHandler *)0x0 &&
                 (ctxt->sax->characters != (charactersSAXFunc)0x0)) && (ctxt->disableSAX == 0)))) {
              p_Var1 = ctxt->sax->characters;
              pvVar2 = ctxt->userData;
              iVar4 = xmlStrlen(pxVar5);
              (*p_Var1)(pvVar2,pxVar5,iVar4);
            }
          }
          else {
            if (((ent_00->flags & 1U) == 0) && (ent_00->children != (_xmlNode *)0x0)) {
              ent_00->flags = ent_00->flags | 1;
            }
            if ((ent_00->etype == XML_INTERNAL_GENERAL_ENTITY) ||
               (((ctxt->options & 0x800000U) == 0 &&
                ((ctxt->replaceEntities != 0 || (ctxt->validate != 0)))))) {
              if ((ent_00->flags & 1U) == 0) {
                xmlCtxtParseEntity(ctxt,ent_00);
              }
              else if (ent_00->children == (_xmlNode *)0x0) {
                xmlCtxtParseEntity(ctxt,ent_00);
              }
            }
            iVar4 = xmlParserEntityCheck(ctxt,ent_00->expandedSize);
            if (((iVar4 == 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) && (ctxt->disableSAX == 0)) {
              if (ctxt->replaceEntities == 0) {
                if (ctxt->sax->reference != (referenceSAXFunc)0x0) {
                  (*ctxt->sax->reference)(ctxt->userData,ent_00->name);
                }
              }
              else if ((ent_00->children != (_xmlNode *)0x0) && (ctxt->node != (xmlNodePtr)0x0)) {
                p_Stack_60 = ent_00->children;
                if ((p_Stack_60->type == XML_TEXT_NODE) ||
                   (p_Stack_60->type == XML_CDATA_SECTION_NODE)) {
                  iVar4 = xmlStrlen(p_Stack_60->content);
                  if ((p_Stack_60->type == XML_TEXT_NODE) || ((ctxt->options & 0x4000U) != 0)) {
                    if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
                      (*ctxt->sax->characters)(ctxt,p_Stack_60->content,iVar4);
                    }
                  }
                  else if (ctxt->sax->cdataBlock != (cdataBlockSAXFunc)0x0) {
                    (*ctxt->sax->cdataBlock)(ctxt,p_Stack_60->content,iVar4);
                  }
                  p_Stack_60 = p_Stack_60->next;
                }
                for (; p_Stack_60 != (xmlNodePtr)0x0; p_Stack_60 = p_Stack_60->next) {
                  if ((p_Stack_60->next == (_xmlNode *)0x0) &&
                     ((p_Stack_60->type == XML_TEXT_NODE ||
                      (p_Stack_60->type == XML_CDATA_SECTION_NODE)))) {
                    iVar4 = xmlStrlen(p_Stack_60->content);
                    if ((p_Stack_60->type != XML_TEXT_NODE) && ((ctxt->options & 0x4000U) == 0)) {
                      if (ctxt->sax->cdataBlock == (cdataBlockSAXFunc)0x0) {
                        return;
                      }
                      (*ctxt->sax->cdataBlock)(ctxt,p_Stack_60->content,iVar4);
                      return;
                    }
                    if (ctxt->sax->characters == (charactersSAXFunc)0x0) {
                      return;
                    }
                    (*ctxt->sax->characters)(ctxt,p_Stack_60->content,iVar4);
                    return;
                  }
                  ctxt->nodemem = 0;
                  ctxt->nodelen = 0;
                  pxVar6 = xmlDocCopyNode(p_Stack_60,ctxt->myDoc,1);
                  if (pxVar6 == (xmlNodePtr)0x0) {
                    xmlErrMemory(ctxt);
                    return;
                  }
                  if (ctxt->parseMode == XML_PARSE_READER) {
                    pxVar6->extra = p_Stack_60->extra;
                    pxVar6->_private = p_Stack_60->_private;
                  }
                  pxVar6->parent = ctxt->node;
                  p_Var3 = ctxt->node->last;
                  if (p_Var3 == (_xmlNode *)0x0) {
                    ctxt->node->children = pxVar6;
                  }
                  else {
                    p_Var3->next = pxVar6;
                    pxVar6->prev = p_Var3;
                  }
                  ctxt->node->last = pxVar6;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlParseReference(xmlParserCtxtPtr ctxt) {
    xmlEntityPtr ent = NULL;
    const xmlChar *name;
    xmlChar *val;

    if (RAW != '&')
        return;

    /*
     * Simple case of a CharRef
     */
    if (NXT(1) == '#') {
	int i = 0;
	xmlChar out[16];
	int value = xmlParseCharRef(ctxt);

	if (value == 0)
	    return;

        /*
         * Just encode the value in UTF-8
         */
        COPY_BUF(out, i, value);
        out[i] = 0;
        if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
            (!ctxt->disableSAX))
            ctxt->sax->characters(ctxt->userData, out, i);
	return;
    }

    /*
     * We are seeing an entity reference
     */
    name = xmlParseEntityRefInternal(ctxt);
    if (name == NULL)
        return;
    ent = xmlLookupGeneralEntity(ctxt, name, /* isAttr */ 0);
    if (ent == NULL) {
        /*
         * Create a reference for undeclared entities.
         */
        if ((ctxt->replaceEntities == 0) &&
            (ctxt->sax != NULL) &&
            (ctxt->disableSAX == 0) &&
            (ctxt->sax->reference != NULL)) {
            ctxt->sax->reference(ctxt->userData, name);
        }
        return;
    }
    if (!ctxt->wellFormed)
	return;

    /* special case of predefined entities */
    if ((ent->name == NULL) ||
        (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
	val = ent->content;
	if (val == NULL) return;
	/*
	 * inline the entity.
	 */
	if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->characters(ctxt->userData, val, xmlStrlen(val));
	return;
    }

    /*
     * Some users try to parse entities on their own and used to set
     * the renamed "checked" member. Fix the flags to cover this
     * case.
     */
    if (((ent->flags & XML_ENT_PARSED) == 0) && (ent->children != NULL))
        ent->flags |= XML_ENT_PARSED;

    /*
     * The first reference to the entity trigger a parsing phase
     * where the ent->children is filled with the result from
     * the parsing.
     * Note: external parsed entities will not be loaded, it is not
     * required for a non-validating parser, unless the parsing option
     * of validating, or substituting entities were given. Doing so is
     * far more secure as the parser will only process data coming from
     * the document entity by default.
     *
     * FIXME: This doesn't work correctly since entities can be
     * expanded with different namespace declarations in scope.
     * For example:
     *
     * <!DOCTYPE doc [
     *   <!ENTITY ent "<ns:elem/>">
     * ]>
     * <doc>
     *   <decl1 xmlns:ns="urn:ns1">
     *     &ent;
     *   </decl1>
     *   <decl2 xmlns:ns="urn:ns2">
     *     &ent;
     *   </decl2>
     * </doc>
     *
     * Proposed fix:
     *
     * - Ignore current namespace declarations when parsing the
     *   entity. If a prefix can't be resolved, don't report an error
     *   but mark it as unresolved.
     * - Try to resolve these prefixes when expanding the entity.
     *   This will require a specialized version of xmlStaticCopyNode
     *   which can also make use of the namespace hash table to avoid
     *   quadratic behavior.
     *
     * Alternatively, we could simply reparse the entity on each
     * expansion like we already do with custom SAX callbacks.
     * External entity content should be cached in this case.
     */
    if ((ent->etype == XML_INTERNAL_GENERAL_ENTITY) ||
        (((ctxt->options & XML_PARSE_NO_XXE) == 0) &&
         ((ctxt->replaceEntities) ||
          (ctxt->validate)))) {
        if ((ent->flags & XML_ENT_PARSED) == 0) {
            xmlCtxtParseEntity(ctxt, ent);
        } else if (ent->children == NULL) {
            /*
             * Probably running in SAX mode and the callbacks don't
             * build the entity content. Parse the entity again.
             *
             * This will also be triggered in normal tree builder mode
             * if an entity happens to be empty, causing unnecessary
             * reloads. It's hard to come up with a reliable check in
             * which mode we're running.
             */
            xmlCtxtParseEntity(ctxt, ent);
        }
    }

    /*
     * We also check for amplification if entities aren't substituted.
     * They might be expanded later.
     */
    if (xmlParserEntityCheck(ctxt, ent->expandedSize))
        return;

    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    if (ctxt->replaceEntities == 0) {
	/*
	 * Create a reference
	 */
        if (ctxt->sax->reference != NULL)
	    ctxt->sax->reference(ctxt->userData, ent->name);
    } else if ((ent->children != NULL) && (ctxt->node != NULL)) {
        xmlNodePtr copy, cur;

        /*
         * Seems we are generating the DOM content, copy the tree
	 */
        cur = ent->children;

        /*
         * Handle first text node with SAX to coalesce text efficiently
         */
        if ((cur->type == XML_TEXT_NODE) ||
            (cur->type == XML_CDATA_SECTION_NODE)) {
            int len = xmlStrlen(cur->content);

            if ((cur->type == XML_TEXT_NODE) ||
                (ctxt->options & XML_PARSE_NOCDATA)) {
                if (ctxt->sax->characters != NULL)
                    ctxt->sax->characters(ctxt, cur->content, len);
            } else {
                if (ctxt->sax->cdataBlock != NULL)
                    ctxt->sax->cdataBlock(ctxt, cur->content, len);
            }

            cur = cur->next;
        }

        while (cur != NULL) {
            xmlNodePtr last;

            /*
             * Handle last text node with SAX to coalesce text efficiently
             */
            if ((cur->next == NULL) &&
                ((cur->type == XML_TEXT_NODE) ||
                 (cur->type == XML_CDATA_SECTION_NODE))) {
                int len = xmlStrlen(cur->content);

                if ((cur->type == XML_TEXT_NODE) ||
                    (ctxt->options & XML_PARSE_NOCDATA)) {
                    if (ctxt->sax->characters != NULL)
                        ctxt->sax->characters(ctxt, cur->content, len);
                } else {
                    if (ctxt->sax->cdataBlock != NULL)
                        ctxt->sax->cdataBlock(ctxt, cur->content, len);
                }

                break;
            }

            /*
             * Reset coalesce buffer stats only for non-text nodes.
             */
            ctxt->nodemem = 0;
            ctxt->nodelen = 0;

            copy = xmlDocCopyNode(cur, ctxt->myDoc, 1);

            if (copy == NULL) {
                xmlErrMemory(ctxt);
                break;
            }

            if (ctxt->parseMode == XML_PARSE_READER) {
                /* Needed for reader */
                copy->extra = cur->extra;
                /* Maybe needed for reader */
                copy->_private = cur->_private;
            }

            copy->parent = ctxt->node;
            last = ctxt->node->last;
            if (last == NULL) {
                ctxt->node->children = copy;
            } else {
                last->next = copy;
                copy->prev = last;
            }
            ctxt->node->last = copy;

            cur = cur->next;
        }
    }
}